

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DuckTransactionManager::RollbackTransaction
          (DuckTransactionManager *this,Transaction *transaction_p)

{
  __uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_> *__u;
  pointer pDVar1;
  FatalException *this_00;
  allocator local_149;
  unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
  cleanup_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ErrorData error;
  
  ErrorData::ErrorData(&error);
  ::std::mutex::lock(&this->transaction_lock);
  DuckTransaction::Rollback((ErrorData *)&cleanup_info,(DuckTransaction *)transaction_p);
  ErrorData::operator=(&error,(ErrorData *)&cleanup_info);
  ErrorData::~ErrorData((ErrorData *)&cleanup_info);
  RemoveTransaction((DuckTransactionManager *)&cleanup_info,(DuckTransaction *)this);
  pDVar1 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>::
           operator->(&cleanup_info);
  if ((pDVar1->transactions).
      super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pDVar1->transactions).
      super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::mutex::lock(&this->cleanup_queue_lock);
    ::std::
    deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>
              ((deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>>
                *)&this->cleanup_queue,&cleanup_info);
    pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_queue_lock);
  }
  ::std::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>::
  ~unique_ptr(&cleanup_info.
               super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
             );
  pthread_mutex_unlock((pthread_mutex_t *)&this->transaction_lock);
  ::std::mutex::lock(&this->cleanup_lock);
  cleanup_info.
  super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>.
  super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>)
       (__uniq_ptr_data<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true,_true>
        )0x0;
  ::std::mutex::lock(&this->cleanup_queue_lock);
  __u = (__uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_> *)
        (this->cleanup_queue).c.
        super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((__uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_> *)
      (this->cleanup_queue).c.
      super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != __u) {
    ::std::__uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>::
    operator=((__uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
               *)&cleanup_info,__u);
    ::std::
    deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
    ::pop_front(&(this->cleanup_queue).c);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_queue_lock);
  if (cleanup_info.
      super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
      .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true,_true>
       )0x0) {
    pDVar1 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
             ::operator->(&cleanup_info);
    DuckCleanupInfo::Cleanup(pDVar1);
  }
  ::std::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>::
  ~unique_ptr(&cleanup_info.
               super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
             );
  pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_lock);
  if (error.initialized != true) {
    ErrorData::~ErrorData(&error);
    return;
  }
  this_00 = (FatalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&cleanup_info,
             "Failed to rollback transaction. Cannot continue operation.\nError: %s",&local_149);
  ::std::__cxx11::string::string((string *)&local_c8,(string *)&error.final_message);
  FatalException::FatalException<std::__cxx11::string>(this_00,(string *)&cleanup_info,&local_c8);
  __cxa_throw(this_00,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DuckTransactionManager::RollbackTransaction(Transaction &transaction_p) {
	auto &transaction = transaction_p.Cast<DuckTransaction>();

	ErrorData error;
	{
		// Obtain the transaction lock and roll back.
		lock_guard<mutex> t_lock(transaction_lock);
		error = transaction.Rollback();

		// Remove the transaction from the list of active transactions and gather cleanup information.
		auto cleanup_info = RemoveTransaction(transaction);
		if (cleanup_info->ScheduleCleanup()) {
			lock_guard<mutex> q_lock(cleanup_queue_lock);
			cleanup_queue.emplace(std::move(cleanup_info));
		}
	}

	{
		lock_guard<mutex> c_lock(cleanup_lock);
		unique_ptr<DuckCleanupInfo> top_cleanup_info;
		{
			lock_guard<mutex> q_lock(cleanup_queue_lock);
			if (!cleanup_queue.empty()) {
				top_cleanup_info = std::move(cleanup_queue.front());
				cleanup_queue.pop();
			}
		}
		if (top_cleanup_info) {
			top_cleanup_info->Cleanup();
		}
	}

	if (error.HasError()) {
		throw FatalException("Failed to rollback transaction. Cannot continue operation.\nError: %s", error.Message());
	}
}